

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

bool __thiscall
glslang::TInputScanner::scanVersion
          (TInputScanner *this,int *version,EProfile *profile,bool *notFirstToken)

{
  int iVar1;
  int iVar2;
  EProfile EVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  byte local_4f;
  bool foundNonSpaceTab;
  char profileString [13];
  
  bVar5 = 0;
  *notFirstToken = false;
  *version = 0;
  *profile = ENoProfile;
  foundNonSpaceTab = false;
  bVar7 = false;
  do {
    do {
      do {
        do {
          do {
            do {
              do {
                do {
                  while( true ) {
                    do {
                      if (bVar7) {
                        *notFirstToken = true;
                        iVar1 = peek(this);
                        if ((iVar1 != 10) && (iVar1 = peek(this), iVar1 != 0xd)) {
                          do {
                            do {
                              iVar1 = get(this);
                            } while (0xe < iVar1 + 1U);
                          } while ((0x4801U >> (iVar1 + 1U & 0x1f) & 1) == 0);
                        }
                        while ((iVar1 = peek(this), iVar1 == 10 ||
                               (iVar1 = peek(this), iVar1 == 0xd))) {
                          get(this);
                        }
                        iVar1 = peek(this);
                        if (iVar1 == -1) {
                          local_4f = 1;
                          goto LAB_003b6598;
                        }
                      }
                      consumeWhitespaceComment(this,&foundNonSpaceTab);
                      bVar4 = bVar5 | foundNonSpaceTab;
                      iVar1 = get(this);
                      bVar7 = true;
                      bVar5 = 1;
                    } while (iVar1 != 0x23);
                    do {
                      do {
                        iVar1 = get(this);
                      } while (iVar1 == 9);
                    } while (iVar1 == 0x20);
                    if (iVar1 == 0x76) break;
                    bVar5 = 1;
                  }
                  iVar1 = get(this);
                  bVar5 = 1;
                } while (iVar1 != 0x65);
                iVar1 = get(this);
                bVar5 = 1;
              } while (iVar1 != 0x72);
              iVar1 = get(this);
              bVar5 = 1;
            } while (iVar1 != 0x73);
            iVar1 = get(this);
            bVar5 = 1;
          } while (iVar1 != 0x69);
          iVar1 = get(this);
          bVar5 = 1;
        } while (iVar1 != 0x6f);
        iVar1 = get(this);
        bVar5 = 1;
      } while (iVar1 != 0x6e);
      do {
        do {
          iVar1 = get(this);
        } while (iVar1 == 9);
      } while (iVar1 == 0x20);
      while( true ) {
        if (9 < iVar1 - 0x30U) break;
        *version = *version * 10 + (iVar1 - 0x30U);
        iVar1 = get(this);
      }
      bVar5 = 1;
    } while (*version == 0);
    while ((iVar1 == 0x20 || (iVar1 == 9))) {
      iVar1 = get(this);
    }
    for (lVar6 = 0; bVar5 = bVar4, lVar6 != 0xd; lVar6 = lVar6 + 1) {
      if ((iVar1 + 1U < 0x22) && ((0x200004c01U >> ((ulong)(iVar1 + 1U) & 0x3f) & 1) != 0)) {
        iVar2 = (int)lVar6;
        if (iVar2 == 0xd) goto LAB_003b6576;
        if (iVar2 == 4) {
          bVar8 = profileString._0_4_ == 0x65726f63;
          EVar3 = ECoreProfile;
        }
        else {
          local_4f = bVar4;
          if (iVar2 != 2) goto LAB_003b6537;
          bVar8 = profileString._0_2_ == 0x7365;
          EVar3 = EEsProfile;
        }
        local_4f = bVar4;
        if (!bVar8) goto LAB_003b6537;
        goto LAB_003b6528;
      }
      profileString[lVar6] = (char)iVar1;
      iVar1 = get(this);
    }
    bVar5 = 1;
    if ((iVar1 + 1U < 0x22) && ((0x200004c01U >> ((ulong)(iVar1 + 1U) & 0x3f) & 1) != 0)) {
LAB_003b6576:
      iVar2 = bcmp(profileString,"compatibility",0xd);
      EVar3 = ECompatibilityProfile;
      local_4f = bVar4;
      bVar5 = bVar4;
      if (iVar2 == 0) {
LAB_003b6528:
        *profile = EVar3;
        local_4f = bVar4;
        bVar5 = bVar4;
      }
    }
LAB_003b6537:
  } while ((0x21 < iVar1 + 1U) || ((0x200004c01U >> ((ulong)(iVar1 + 1U) & 0x3f) & 1) == 0));
LAB_003b6598:
  return (bool)(local_4f & 1);
}

Assistant:

bool TInputScanner::scanVersion(int& version, EProfile& profile, bool& notFirstToken)
{
    // This function doesn't have to get all the semantics correct,
    // just find the #version if there is a correct one present.
    // The preprocessor will have the responsibility of getting all the semantics right.

    bool versionNotFirst = false;  // means not first WRT comments and white space, nothing more
    notFirstToken = false;         // means not first WRT to real tokens
    version = 0;                   // means not found
    profile = ENoProfile;

    bool foundNonSpaceTab = false;
    bool lookingInMiddle = false;
    int c;
    do {
        if (lookingInMiddle) {
            notFirstToken = true;
            // make forward progress by finishing off the current line plus extra new lines
            if (peek() != '\n' && peek() != '\r') {
                do {
                    c = get();
                } while (c != EndOfInput && c != '\n' && c != '\r');
            }
            while (peek() == '\n' || peek() == '\r')
                get();
            if (peek() == EndOfInput)
                return true;
        }
        lookingInMiddle = true;

        // Nominal start, skipping the desktop allowed comments and white space, but tracking if
        // something else was found for ES:
        consumeWhitespaceComment(foundNonSpaceTab);
        if (foundNonSpaceTab)
            versionNotFirst = true;

        // "#"
        if (get() != '#') {
            versionNotFirst = true;
            continue;
        }

        // whitespace
        do {
            c = get();
        } while (c == ' ' || c == '\t');

        // "version"
        if (    c != 'v' ||
            get() != 'e' ||
            get() != 'r' ||
            get() != 's' ||
            get() != 'i' ||
            get() != 'o' ||
            get() != 'n') {
            versionNotFirst = true;
            continue;
        }

        // whitespace
        do {
            c = get();
        } while (c == ' ' || c == '\t');

        // version number
        while (c >= '0' && c <= '9') {
            version = 10 * version + (c - '0');
            c = get();
        }
        if (version == 0) {
            versionNotFirst = true;
            continue;
        }

        // whitespace
        while (c == ' ' || c == '\t')
            c = get();

        // profile
        const int maxProfileLength = 13;  // not including any 0
        char profileString[maxProfileLength];
        int profileLength;
        for (profileLength = 0; profileLength < maxProfileLength; ++profileLength) {
            if (c == EndOfInput || c == ' ' || c == '\t' || c == '\n' || c == '\r')
                break;
            profileString[profileLength] = (char)c;
            c = get();
        }
        if (c != EndOfInput && c != ' ' && c != '\t' && c != '\n' && c != '\r') {
            versionNotFirst = true;
            continue;
        }

        if (profileLength == 2 && strncmp(profileString, "es", profileLength) == 0)
            profile = EEsProfile;
        else if (profileLength == 4 && strncmp(profileString, "core", profileLength) == 0)
            profile = ECoreProfile;
        else if (profileLength == 13 && strncmp(profileString, "compatibility", profileLength) == 0)
            profile = ECompatibilityProfile;

        return versionNotFirst;
    } while (true);
}